

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSComputerRS232Port.h
# Opt level: O2

int CheckAvailBytesComputerRS232Port(HANDLE hDev,int *pNbBytesAvail)

{
  int iVar1;
  int bytes_avail;
  
  iVar1 = ioctl((int)hDev,0x541b);
  if (iVar1 == 0) {
    iVar1 = 2;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int CheckAvailBytesComputerRS232Port(HANDLE hDev, int* pNbBytesAvail)
{
#ifdef _WIN32
	COMSTAT stats;

	memset(&stats, 0, sizeof(COMSTAT));
	if (!ClearCommError(hDev, NULL, &stats))
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("CheckAvailableBytesComputerRS232Port error (%s) : %s(hDev=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev));
		return EXIT_FAILURE;
	}
	if (stats.cbInQue <= 0) return EXIT_TIMEOUT;
	if (pNbBytesAvail) *pNbBytesAvail = (int)stats.cbInQue;
#else
	int bytes_avail = 0;

	if (ioctl((intptr_t)hDev, FIONREAD, &bytes_avail) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("CheckAvailableBytesComputerRS232Port error (%s) : (FIONREAD) %s(hDev=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev));
		return EXIT_FAILURE;
	}
	if (bytes_avail <= 0) return EXIT_TIMEOUT;
	if (pNbBytesAvail) *pNbBytesAvail = (int)bytes_avail;
#endif // _WIN32

	return EXIT_SUCCESS;
}